

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.h
# Opt level: O3

void __thiscall
VW::object_pool<obj,_obj_initializer>::new_chunk
          (object_pool<obj,_obj_initializer> *this,size_t size)

{
  iterator *piVar1;
  pointer *pppVar2;
  pointer puVar3;
  iterator __position;
  _Elt_pointer ppoVar4;
  long lVar5;
  pair<obj_*,_obj_*> local_40;
  
  if (size != 0) {
    local_40.first = (obj *)operator_new__(-(ulong)(size >> 0x3e != 0) | size * 4);
    std::
    vector<std::unique_ptr<obj[],std::default_delete<obj[]>>,std::allocator<std::unique_ptr<obj[],std::default_delete<obj[]>>>>
    ::emplace_back<std::unique_ptr<obj[],std::default_delete<obj[]>>>
              ((vector<std::unique_ptr<obj[],std::default_delete<obj[]>>,std::allocator<std::unique_ptr<obj[],std::default_delete<obj[]>>>>
                *)&this->m_chunks,(unique_ptr<obj[],_std::default_delete<obj[]>_> *)&local_40);
    if (local_40.first != (obj *)0x0) {
      operator_delete__(local_40.first);
    }
    puVar3 = (this->m_chunks).
             super__Vector_base<std::unique_ptr<obj[],_std::default_delete<obj[]>_>,_std::allocator<std::unique_ptr<obj[],_std::default_delete<obj[]>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_40.first =
         puVar3[-1]._M_t.super___uniq_ptr_impl<obj,_std::default_delete<obj[]>_>._M_t.
         super__Tuple_impl<0UL,_obj_*,_std::default_delete<obj[]>_>.
         super__Head_base<0UL,_obj_*,_false>._M_head_impl;
    local_40.second = local_40.first + size + -1;
    __position._M_current =
         (this->m_chunk_bounds).
         super__Vector_base<std::pair<obj_*,_obj_*>,_std::allocator<std::pair<obj_*,_obj_*>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_chunk_bounds).
        super__Vector_base<std::pair<obj_*,_obj_*>,_std::allocator<std::pair<obj_*,_obj_*>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<obj*,obj*>,std::allocator<std::pair<obj*,obj*>>>::
      _M_realloc_insert<std::pair<obj*,obj*>>
                ((vector<std::pair<obj*,obj*>,std::allocator<std::pair<obj*,obj*>>> *)
                 &this->m_chunk_bounds,__position,&local_40);
    }
    else {
      (__position._M_current)->first = local_40.first;
      (__position._M_current)->second = local_40.second;
      pppVar2 = &(this->m_chunk_bounds).
                 super__Vector_base<std::pair<obj_*,_obj_*>,_std::allocator<std::pair<obj_*,_obj_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pppVar2 = *pppVar2 + 1;
    }
    lVar5 = 0;
    do {
      *(undefined4 *)
       ((long)&(puVar3[-1]._M_t.super___uniq_ptr_impl<obj,_std::default_delete<obj[]>_>._M_t.
                super__Tuple_impl<0UL,_obj_*,_std::default_delete<obj[]>_>.
                super__Head_base<0UL,_obj_*,_false>._M_head_impl)->i + lVar5) = 0;
      *(undefined4 *)
       ((long)&(puVar3[-1]._M_t.super___uniq_ptr_impl<obj,_std::default_delete<obj[]>_>._M_t.
                super__Tuple_impl<0UL,_obj_*,_std::default_delete<obj[]>_>.
                super__Head_base<0UL,_obj_*,_false>._M_head_impl)->i + lVar5) = 0;
      local_40.first =
           (obj *)((long)&(puVar3[-1]._M_t.super___uniq_ptr_impl<obj,_std::default_delete<obj[]>_>.
                           _M_t.super__Tuple_impl<0UL,_obj_*,_std::default_delete<obj[]>_>.
                           super__Head_base<0UL,_obj_*,_false>._M_head_impl)->i + lVar5);
      ppoVar4 = (this->m_pool).c.super__Deque_base<obj_*,_std::allocator<obj_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      if (ppoVar4 ==
          (this->m_pool).c.super__Deque_base<obj_*,_std::allocator<obj_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<obj*,std::allocator<obj*>>::_M_push_back_aux<obj*>
                  ((deque<obj*,std::allocator<obj*>> *)&this->m_pool,&local_40.first);
      }
      else {
        *ppoVar4 = local_40.first;
        piVar1 = &(this->m_pool).c.super__Deque_base<obj_*,_std::allocator<obj_*>_>._M_impl.
                  super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      lVar5 = lVar5 + 4;
      size = size - 1;
    } while (size != 0);
  }
  return;
}

Assistant:

void new_chunk(size_t size)
  {
    if(size == 0)
    {
      return;
    }

    m_chunks.push_back(std::unique_ptr<T[]>(new T[size]));
    auto& chunk = m_chunks.back();
    m_chunk_bounds.push_back({&chunk[0], &chunk[size - 1]});

    for (size_t i = 0; i < size; i++)
    {
      memset(&chunk[i], 0, sizeof(T));
      new (&chunk[i]) T{};
      m_pool.push(m_initializer(&chunk[i]));
    }
  }